

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sVertexArrayTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Stress::anon_unknown_1::SingleVertexArrayOffsetTests::init
          (SingleVertexArrayOffsetTests *this,EVP_PKEY_CTX *ctx)

{
  SingleVertexArrayOffsetGroup *this_00;
  int local_1c;
  InputType IStack_18;
  int inputTypeNdx;
  InputType inputTypes [2];
  SingleVertexArrayOffsetTests *this_local;
  
  _IStack_18 = 0xb00000000;
  inputTypes = (InputType  [2])this;
  for (local_1c = 0; local_1c < 2; local_1c = local_1c + 1) {
    this_00 = (SingleVertexArrayOffsetGroup *)operator_new(0x80);
    SingleVertexArrayOffsetGroup::SingleVertexArrayOffsetGroup
              (this_00,(this->super_TestCaseGroup).m_context,(&IStack_18)[local_1c]);
    tcu::TestNode::addChild((TestNode *)this,(TestNode *)this_00);
  }
  return local_1c;
}

Assistant:

void SingleVertexArrayOffsetTests::init (void)
{
	// Test offset with different input types, component counts and storage, Usage(?)
	Array::InputType	inputTypes[]	= {Array::INPUTTYPE_FLOAT, Array::INPUTTYPE_INT_2_10_10_10 };

	for (int inputTypeNdx = 0; inputTypeNdx < DE_LENGTH_OF_ARRAY(inputTypes); inputTypeNdx++)
	{
		addChild(new SingleVertexArrayOffsetGroup(m_context, inputTypes[inputTypeNdx]));
	}
}